

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(int lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar2;
  char in_SIL;
  int in_EDI;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 uVar3;
  int local_8;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1;
  
  local_8 = in_EDI;
  local_2.m_int = in_SIL;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_1);
  uVar3 = CONCAT13(local_2.m_int,(int3)in_stack_fffffffffffffff4);
  bVar1 = ModulusSimpleCaseHelper<char,_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::ModulusSimpleCase(local_8,local_2,&local_1);
  if (!bVar1) {
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffec,&local_8);
    SafeInt::operator_cast_to_char
              ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(uVar3,in_stack_fffffffffffffff0));
    SVar2 = SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                      (in_stack_ffffffffffffffe8,'\0');
    SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
              ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(uVar3,SVar2.m_int),in_stack_ffffffffffffffe8);
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_1.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}